

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::KillOperandFromDebugInstructions(IRContext *this,Instruction *inst)

{
  Op opcode;
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  OpenCLDebugInfo100Instructions OVar4;
  uint32_t uVar5;
  CommonDebugInfoInstructions CVar6;
  Module *pMVar7;
  Operand *pOVar8;
  uint **ppuVar9;
  DebugInfoManager *pDVar10;
  Instruction *pIVar11;
  DefUseManager *pDVar12;
  uint **ppuVar13;
  Instruction **ppIVar14;
  
  opcode = inst->opcode_;
  uVar3 = Instruction::result_id(inst);
  if (opcode != OpVariable) {
    if (opcode == OpFunction) {
      pMVar7 = (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      ppIVar14 = (Instruction **)
                 ((long)&(pMVar7->ext_inst_debuginfo_).
                         super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      while (pIVar1 = *ppIVar14,
            pIVar1 != &(pMVar7->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>
                       .sentinel_) {
        OVar4 = Instruction::GetOpenCL100DebugOpcode(pIVar1);
        if (OVar4 == OpenCLDebugInfo100DebugFunction) {
          pOVar8 = Instruction::GetOperand(pIVar1,0xd);
          ppuVar9 = (uint **)(pOVar8->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar13 = &(pOVar8->words).small_data_;
          if (ppuVar9 == (uint **)0x0) {
            ppuVar9 = ppuVar13;
          }
          if (**ppuVar9 == uVar3) {
            pDVar10 = get_debug_info_mgr(this);
            pIVar11 = analysis::DebugInfoManager::GetDebugInfoNone(pDVar10);
            uVar5 = Instruction::result_id(pIVar11);
            ppuVar9 = (uint **)(pOVar8->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            if (ppuVar9 != (uint **)0x0) {
              ppuVar13 = ppuVar9;
            }
            **ppuVar13 = uVar5;
            pDVar12 = get_def_use_mgr(this);
            analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar1);
          }
        }
        pMVar7 = (this->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        ppIVar14 = &(pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
    bVar2 = IsConstantInst(opcode);
    if (!bVar2) {
      return;
    }
  }
  pMVar7 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar14 = (Instruction **)
             ((long)&(pMVar7->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  while (pIVar1 = *ppIVar14,
        pIVar1 != &(pMVar7->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_) {
    CVar6 = Instruction::GetCommonDebugOpcode(pIVar1);
    if (CVar6 == CommonDebugInfoDebugGlobalVariable) {
      pOVar8 = Instruction::GetOperand(pIVar1,0xb);
      ppuVar9 = (uint **)(pOVar8->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar13 = &(pOVar8->words).small_data_;
      if (ppuVar9 == (uint **)0x0) {
        ppuVar9 = ppuVar13;
      }
      if (**ppuVar9 == uVar3) {
        pDVar10 = get_debug_info_mgr(this);
        pIVar11 = analysis::DebugInfoManager::GetDebugInfoNone(pDVar10);
        uVar5 = Instruction::result_id(pIVar11);
        ppuVar9 = (uint **)(pOVar8->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        if (ppuVar9 != (uint **)0x0) {
          ppuVar13 = ppuVar9;
        }
        **ppuVar13 = uVar5;
        pDVar12 = get_def_use_mgr(this);
        analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar1);
      }
    }
    pMVar7 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    ppIVar14 = &(pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return;
}

Assistant:

void IRContext::KillOperandFromDebugInstructions(Instruction* inst) {
  const auto opcode = inst->opcode();
  const uint32_t id = inst->result_id();
  // Kill id of OpFunction from DebugFunction.
  if (opcode == spv::Op::OpFunction) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetOpenCL100DebugOpcode() != OpenCLDebugInfo100DebugFunction)
        continue;
      auto& operand = it->GetOperand(kDebugFunctionOperandFunctionIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
  // Kill id of OpVariable for global variable from DebugGlobalVariable.
  if (opcode == spv::Op::OpVariable || IsConstantInst(opcode)) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
        continue;
      auto& operand = it->GetOperand(kDebugGlobalVariableOperandVariableIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
}